

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayImageTextureSize.cpp
# Opt level: O2

void __thiscall
glcts::TextureCubeMapArrayTextureSizeRTComputeShader::deleteProgram
          (TextureCubeMapArrayTextureSizeRTComputeShader *this)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*((this->super_TextureCubeMapArrayTextureSizeRTBase).
             super_TextureCubeMapArrayTextureSizeBase.super_TestCaseBase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  if (*(int *)&(this->super_TextureCubeMapArrayTextureSizeRTBase).field_0x2cc != 0) {
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x470))();
    *(undefined4 *)&(this->super_TextureCubeMapArrayTextureSizeRTBase).field_0x2cc = 0;
  }
  return;
}

Assistant:

void TextureCubeMapArrayTextureSizeRTComputeShader::deleteProgram(void)
{
	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Delete shader objects */
	if (m_cs_id != 0)
	{
		gl.deleteShader(m_cs_id);
		m_cs_id = 0;
	}
}